

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DenseMap.h
# Opt level: O1

ExternFuncInfo ** __thiscall
SmallDenseMap<unsigned_int,_ExternFuncInfo_*,_SmallDenseMapUnsignedHasher,_32U>::find
          (SmallDenseMap<unsigned_int,_ExternFuncInfo_*,_SmallDenseMapUnsignedHasher,_32U> *this,
          uint *key)

{
  uint uVar1;
  uint uVar2;
  ExternFuncInfo **in_RAX;
  uint uVar3;
  uint uVar4;
  bool bVar5;
  
  uVar1 = this->bucketCount;
  if (uVar1 != 0) {
    uVar3 = *key * -0x61c88647 & uVar1 - 1;
    uVar4 = 1;
    do {
      uVar2 = this->data[uVar3].key;
      if (uVar2 == 0) {
        bVar5 = false;
        in_RAX = (ExternFuncInfo **)0x0;
      }
      else if (uVar2 == *key) {
        in_RAX = &this->data[uVar3].value;
        bVar5 = false;
      }
      else {
        uVar3 = uVar3 + uVar4 & uVar1 - 1;
        bVar5 = true;
      }
      if (!bVar5) {
        return in_RAX;
      }
      bVar5 = uVar4 != uVar1;
      uVar4 = uVar4 + 1;
    } while (bVar5);
  }
  return (ExternFuncInfo **)0x0;
}

Assistant:

Value* find(const Key& key) const
	{
		unsigned bucketMask = bucketCount - 1;
		unsigned bucket = Hasher()(key) & bucketMask;

		for(unsigned i = 0; i < bucketCount; i++)
		{
			Node &item = data[bucket];

			if(item.key == Key())
				return NULL;

			if(item.key == key)
				return &item.value;

			// Quadratic probing
			bucket = (bucket + i + 1) & bucketMask;
		}

		return NULL;
	}